

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-interpreter.h
# Opt level: O2

Flow * __thiscall
wasm::ModuleRunnerBase<wasm::ModuleRunner>::visitMemoryInit
          (Flow *__return_storage_ptr__,ModuleRunnerBase<wasm::ModuleRunner> *this,MemoryInit *curr)

{
  char **this_00;
  ExternalInterface *pEVar1;
  Name memory;
  undefined1 this_01 [8];
  uint uVar2;
  DataSegment *pDVar3;
  Literal *pLVar4;
  uint64_t uVar5;
  size_type sVar6;
  Address AVar7;
  ulong uVar8;
  ulong uVar9;
  bool bVar10;
  undefined1 local_170 [8];
  Flow dest;
  Flow offset;
  Flow size;
  undefined1 local_80 [8];
  Literal addr;
  undefined1 local_60 [8];
  MemoryInstanceInfo info;
  
  ExpressionRunner<wasm::ModuleRunner>::visit
            ((Flow *)local_170,&this->super_ExpressionRunner<wasm::ModuleRunner>,curr->dest);
  if (dest.breakTo.super_IString.str._M_len == 0) {
    ExpressionRunner<wasm::ModuleRunner>::visit
              ((Flow *)&dest.breakTo.super_IString.str._M_str,
               &this->super_ExpressionRunner<wasm::ModuleRunner>,curr->offset);
    if (offset.breakTo.super_IString.str._M_len == 0) {
      ExpressionRunner<wasm::ModuleRunner>::visit
                ((Flow *)&offset.breakTo.super_IString.str._M_str,
                 &this->super_ExpressionRunner<wasm::ModuleRunner>,curr->size);
      if (size.breakTo.super_IString.str._M_len == 0) {
        pDVar3 = Module::getDataSegment(this->wasm,(Name)(curr->segment).super_IString.str);
        addr.type.id = (uintptr_t)__return_storage_ptr__;
        pLVar4 = Flow::getSingleValue((Flow *)local_170);
        uVar5 = Literal::getUnsigned(pLVar4);
        pLVar4 = Flow::getSingleValue((Flow *)&dest.breakTo.super_IString.str._M_str);
        uVar2 = Literal::geti32(pLVar4);
        uVar8 = (ulong)uVar2;
        pLVar4 = Flow::getSingleValue((Flow *)&offset.breakTo.super_IString.str._M_str);
        uVar2 = Literal::geti32(pLVar4);
        uVar9 = (ulong)uVar2;
        if (uVar8 + uVar9 != 0) {
          sVar6 = std::
                  _Hashtable<wasm::Name,_wasm::Name,_std::allocator<wasm::Name>,_std::__detail::_Identity,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                  ::count(&(this->droppedSegments)._M_h,&curr->segment);
          if (sVar6 != 0) {
            (*(this->super_ExpressionRunner<wasm::ModuleRunner>)._vptr_ExpressionRunner[2])
                      (this,"out of bounds segment access in memory.init");
          }
        }
        if ((ulong)((long)(pDVar3->data).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                          super__Vector_impl_data._M_finish -
                   (long)(pDVar3->data).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                         super__Vector_impl_data._M_start) < uVar8 + uVar9) {
          (*(this->super_ExpressionRunner<wasm::ModuleRunner>)._vptr_ExpressionRunner[2])
                    (this,"out of bounds segment access in memory.init");
        }
        getMemoryInstanceInfo
                  ((MemoryInstanceInfo *)local_60,this,(Name)(curr->memory).super_IString.str);
        memory.super_IString.str._M_str = (char *)info.name.super_IString.str._M_len;
        memory.super_IString.str._M_len = (size_t)info.instance;
        info.name.super_IString.str._M_str =
             (char *)getMemorySize((ModuleRunnerBase<wasm::ModuleRunner> *)local_60,memory);
        if ((ulong)((long)info.name.super_IString.str._M_str << 0x10) < uVar5 + uVar9) {
          (*(this->super_ExpressionRunner<wasm::ModuleRunner>)._vptr_ExpressionRunner[2])
                    (this,"out of bounds memory access in memory.init");
        }
        this_00 = &size.breakTo.super_IString.str._M_str;
        while (this_01 = local_60, bVar10 = uVar9 != 0, uVar9 = uVar9 - 1, bVar10) {
          addr.field_0.func.super_IString.str._M_str = (char *)0x3;
          pEVar1 = *(ExternalInterface **)((long)local_60 + 0x288);
          local_80 = (undefined1  [8])uVar5;
          Literal::Literal((Literal *)this_00,(Literal *)local_80);
          AVar7 = getFinalAddressWithoutOffset
                            ((ModuleRunnerBase<wasm::ModuleRunner> *)this_01,(Literal *)this_00,1,
                             (Address)info.name.super_IString.str._M_str);
          (*pEVar1->_vptr_ExternalInterface[0x16])
                    (pEVar1,AVar7.addr,
                     (ulong)(uint)(int)(pDVar3->data).
                                       super__Vector_base<char,_std::allocator<char>_>._M_impl.
                                       super__Vector_impl_data._M_start[uVar8],info.instance,
                     info.name.super_IString.str._M_len);
          Literal::~Literal((Literal *)this_00);
          Literal::~Literal((Literal *)local_80);
          uVar8 = uVar8 + 1;
          uVar5 = uVar5 + 1;
        }
        *(undefined8 *)(addr.type.id + 0x30) = 0;
        *(undefined8 *)(addr.type.id + 0x38) = 0;
        *(undefined8 *)(addr.type.id + 0x20) = 0;
        *(undefined8 *)(addr.type.id + 0x28) = 0;
        *(undefined8 *)(addr.type.id + 0x10) = 0;
        *(undefined8 *)(addr.type.id + 0x18) = 0;
        *(undefined8 *)addr.type.id = 0;
        *(undefined8 *)(addr.type.id + 8) = 0;
        *(undefined8 *)(addr.type.id + 0x40) = 0;
        __return_storage_ptr__ = (Flow *)addr.type.id;
      }
      else {
        Flow::Flow(__return_storage_ptr__,(Flow *)&offset.breakTo.super_IString.str._M_str);
      }
      SmallVector<wasm::Literal,_1UL>::~SmallVector
                ((SmallVector<wasm::Literal,_1UL> *)&offset.breakTo.super_IString.str._M_str);
    }
    else {
      Flow::Flow(__return_storage_ptr__,(Flow *)&dest.breakTo.super_IString.str._M_str);
    }
    SmallVector<wasm::Literal,_1UL>::~SmallVector
              ((SmallVector<wasm::Literal,_1UL> *)&dest.breakTo.super_IString.str._M_str);
  }
  else {
    Flow::Flow(__return_storage_ptr__,(Flow *)local_170);
  }
  SmallVector<wasm::Literal,_1UL>::~SmallVector((SmallVector<wasm::Literal,_1UL> *)local_170);
  return __return_storage_ptr__;
}

Assistant:

Flow visitMemoryInit(MemoryInit* curr) {
    NOTE_ENTER("MemoryInit");
    Flow dest = self()->visit(curr->dest);
    if (dest.breaking()) {
      return dest;
    }
    Flow offset = self()->visit(curr->offset);
    if (offset.breaking()) {
      return offset;
    }
    Flow size = self()->visit(curr->size);
    if (size.breaking()) {
      return size;
    }
    NOTE_EVAL1(dest);
    NOTE_EVAL1(offset);
    NOTE_EVAL1(size);

    auto* segment = wasm.getDataSegment(curr->segment);

    Address destVal(dest.getSingleValue().getUnsigned());
    Address offsetVal(uint32_t(offset.getSingleValue().geti32()));
    Address sizeVal(uint32_t(size.getSingleValue().geti32()));

    if (offsetVal + sizeVal > 0 && droppedSegments.count(curr->segment)) {
      trap("out of bounds segment access in memory.init");
    }
    if ((uint64_t)offsetVal + sizeVal > segment->data.size()) {
      trap("out of bounds segment access in memory.init");
    }
    auto info = getMemoryInstanceInfo(curr->memory);
    auto memorySize = info.instance->getMemorySize(info.name);
    if (destVal + sizeVal > memorySize * Memory::kPageSize) {
      trap("out of bounds memory access in memory.init");
    }
    for (size_t i = 0; i < sizeVal; ++i) {
      Literal addr(destVal + i);
      info.instance->externalInterface->store8(
        info.instance->getFinalAddressWithoutOffset(addr, 1, memorySize),
        segment->data[offsetVal + i],
        info.name);
    }
    return {};
  }